

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

string * google::protobuf::anon_unknown_1::ToCamelCase
                   (string *__return_storage_ptr__,string *input,bool lower_first)

{
  char cVar1;
  string *psVar2;
  char cVar3;
  ulong uVar4;
  ulong unaff_R13;
  bool bVar5;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  psVar2 = (string *)std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  if (input->_M_string_length != 0) {
    uVar4 = 0;
    do {
      bVar5 = (input->_M_dataplus)._M_p[uVar4] == '_';
      unaff_R13 = CONCAT71((int7)(unaff_R13 >> 8),bVar5);
      if (!bVar5) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      uVar4 = uVar4 + 1;
      psVar2 = (string *)(unaff_R13 & 0xffffffff);
    } while (uVar4 < input->_M_string_length);
  }
  if ((lower_first) && (__return_storage_ptr__->_M_string_length != 0)) {
    psVar2 = (string *)(__return_storage_ptr__->_M_dataplus)._M_p;
    cVar1 = *(char *)&(psVar2->_M_dataplus)._M_p;
    cVar3 = cVar1 + ' ';
    if (0x19 < (byte)(cVar1 + 0xbfU)) {
      cVar3 = cVar1;
    }
    *(char *)&(psVar2->_M_dataplus)._M_p = cVar3;
  }
  return psVar2;
}

Assistant:

std::string ToCamelCase(const std::string& input, bool lower_first) {
  bool capitalize_next = !lower_first;
  std::string result;
  result.reserve(input.size());

  for (int i = 0; i < input.size(); i++) {
    if (input[i] == '_') {
      capitalize_next = true;
    } else if (capitalize_next) {
      result.push_back(ToUpper(input[i]));
      capitalize_next = false;
    } else {
      result.push_back(input[i]);
    }
  }

  // Lower-case the first letter.
  if (lower_first && !result.empty()) {
    result[0] = ToLower(result[0]);
  }

  return result;
}